

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

size_t intersect_accel<true,true,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  pointer pNVar1;
  long lVar2;
  Index IVar3;
  pointer pNVar4;
  pointer pPVar5;
  bool bVar6;
  float fVar7;
  undefined1 auVar8 [16];
  Index IVar9;
  Index IVar10;
  long lVar11;
  size_t j;
  ulong uVar12;
  ulong uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float t1;
  uint local_20c;
  undefined1 local_208 [12];
  undefined1 auStack_1fc [4];
  Vec<float,_3UL> v;
  undefined1 local_1d8 [8];
  Vec<float,_3UL> *local_1d0;
  float *local_1c8;
  Vec<float,_3UL> *local_1c0;
  long local_1b8;
  Accel *local_1b0;
  Vec<float,_3UL> local_1a8;
  size_t local_198;
  TraversalStats *local_190;
  Vec<float,_3UL> *local_188;
  Index<32UL,_4UL> local_17c;
  undefined1 local_178 [16];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  SmallStack<bvh::v2::Index<32UL,_4UL>,_64U> stack;
  
  auVar26._8_4_ = 0x3f800000;
  auVar26._0_8_ = 0x3f8000003f800000;
  auVar26._12_4_ = 0x3f800000;
  local_188 = &ray->dir;
  stack.size = 0;
  uVar12 = *(ulong *)(ray->dir).values;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = uVar12;
  local_17c.value =
       (((accel->bvh).nodes.
         super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->index).value;
  _local_148 = vdivps_avx(auVar26,auVar19);
  fVar34 = 1.0 / (ray->dir).values[2];
  local_158 = ZEXT416((uint)fVar34);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)((ray->dir).values + 1);
  auVar15 = vpsrlvd_avx2(auVar20,_DAT_001170f0);
  auVar14._8_4_ = 2;
  auVar14._0_8_ = 0x400000002;
  auVar14._12_4_ = 4;
  auVar14 = vpandq_avx512vl(auVar15,auVar14);
  auVar15._8_4_ = 0x7fffffff;
  auVar15._0_8_ = 0x7fffffff7fffffff;
  auVar15._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx512vl(_local_148,auVar15);
  auVar16._8_4_ = 0x7f800000;
  auVar16._0_8_ = 0x7f8000007f800000;
  auVar16._12_4_ = 0x7f800000;
  uVar13 = vpcmpd_avx512vl(auVar15,auVar16,1);
  uVar13 = uVar13 & 0xf;
  auVar8._8_4_ = 2;
  auVar8._0_8_ = 0x200000002;
  auVar8._12_4_ = 2;
  auVar15 = vpaddd_avx512vl(_local_148,auVar8);
  auVar16 = vblendmps_avx512vl(_local_148,auVar15);
  bVar6 = (bool)((byte)uVar13 & 1);
  local_168 = (float)((uint)bVar6 * auVar16._0_4_ | (uint)!bVar6 * auVar15._0_4_);
  bVar6 = (bool)((byte)(uVar13 >> 1) & 1);
  fStack_164 = (float)((uint)bVar6 * auVar16._4_4_ | (uint)!bVar6 * auVar15._4_4_);
  bVar6 = (bool)((byte)(uVar13 >> 2) & 1);
  fStack_160 = (float)((uint)bVar6 * auVar16._8_4_ | (uint)!bVar6 * auVar15._8_4_);
  bVar6 = SUB81(uVar13 >> 3,0);
  fStack_15c = (float)((uint)bVar6 * auVar16._12_4_ | (uint)!bVar6 * auVar15._12_4_);
  local_178 = ZEXT416((uint)((uint)ABS(fVar34) < 0x7f800000) * ((int)fVar34 + 2) +
                      (uint)((uint)ABS(fVar34) >= 0x7f800000) * (int)fVar34);
  local_20c = auVar14._4_4_ | auVar14._0_4_ | (uint)uVar12 >> 0x1f;
  local_190 = stats;
  bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push(&stack,&local_17c);
  local_198 = 0xffffffffffffffff;
  local_1b0 = accel;
LAB_001079e3:
  do {
    if (stack.size == 0) {
      return local_198;
    }
    IVar10.value = (Type)bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::pop(&stack);
    while( true ) {
      uVar12 = (ulong)(IVar10.value >> 4);
      if ((IVar10.value & 0xf) != 0) break;
      pNVar4 = (accel->bvh).nodes.
               super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      unique0x00004e80 = &local_20c;
      local_1d8 = (undefined1  [8])&v;
      pNVar1 = pNVar4 + uVar12;
      local_190->visited_nodes = local_190->visited_nodes + 1;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(ulong *)(ray->org).values;
      auVar15 = vinsertps_avx(ZEXT416(*(uint *)((long)&pNVar1->bounds + (ulong)(local_20c & 1) * 4))
                              ,ZEXT416(*(uint *)((long)&pNVar1->bounds +
                                                (ulong)(local_20c * 2 & 4) + 8)),0x10);
      local_1a8.values[2] =
           (*(float *)((long)&pNVar1->bounds + (ulong)(local_20c & 4) + 0x10) - (ray->org).values[2]
           ) * (float)local_158._0_4_;
      auVar15 = vsubps_avx(auVar15,auVar27);
      auVar28._0_4_ = auVar15._0_4_ * (float)local_148._0_4_;
      auVar28._4_4_ = auVar15._4_4_ * (float)local_148._4_4_;
      auVar28._8_4_ = auVar15._8_4_ * fStack_140;
      auVar28._12_4_ = auVar15._12_4_ * fStack_13c;
      local_1a8.values._0_8_ = vmovlps_avx(auVar28);
      local_208._0_8_ = pNVar1;
      local_1d0 = (Vec<float,_3UL> *)local_208;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,2);
      auVar21._4_4_ = v.values[1];
      auVar21._0_4_ = v.values[0];
      auVar21._8_8_ = 0;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)(ray->org).values;
      local_1d0 = &local_1a8;
      auVar15 = vsubps_avx(auVar21,auVar32);
      auVar22._0_4_ = auVar15._0_4_ * local_168;
      auVar22._4_4_ = auVar15._4_4_ * fStack_164;
      auVar22._8_4_ = auVar15._8_4_ * fStack_160;
      auVar22._12_4_ = auVar15._12_4_ * fStack_15c;
      local_208._0_8_ = vmovlps_avx(auVar22);
      stack0xfffffffffffffe00 =
           (uint *)CONCAT44(auStack_1fc,
                            (v.values[2] - (ray->org).values[2]) * (float)local_178._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = &t1;
      local_1d8 = (undefined1  [8])&v;
      local_1c0 = (Vec<float,_3UL> *)local_208;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,2);
      fVar34 = t1;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(ray->org).values;
      auVar15 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar1 + 1) + (ulong)(local_20c & 1) * 4)),
                              ZEXT416(*(uint *)((long)(pNVar1 + 1) + 8U + (ulong)(local_20c * 2 & 4)
                                               )),0x10);
      local_1b8 = CONCAT44(local_1b8._4_4_,v.values[0]);
      auVar15 = vsubps_avx(auVar15,auVar29);
      auVar30._0_4_ = auVar15._0_4_ * (float)local_148._0_4_;
      auVar30._4_4_ = auVar15._4_4_ * (float)local_148._4_4_;
      auVar30._8_4_ = auVar15._8_4_ * fStack_140;
      auVar30._12_4_ = auVar15._12_4_ * fStack_13c;
      local_1a8.values[2] =
           (*(float *)((long)(pNVar1 + 1) + 0x10U + (ulong)(local_20c & 4)) - (ray->org).values[2])
           * (float)local_158._0_4_;
      unique0x00004e80 = &local_20c;
      local_1a8.values._0_8_ = vmovlps_avx(auVar30);
      local_208._0_8_ = pNVar4 + uVar12 + 1;
      local_1d8 = (undefined1  [8])&v;
      local_1d0 = (Vec<float,_3UL> *)local_208;
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,0);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,1);
      anon_func::anon_class_16_2_94732099::operator()((anon_class_16_2_94732099 *)local_1d8,2);
      auVar23._4_4_ = v.values[1];
      auVar23._0_4_ = v.values[0];
      auVar23._8_8_ = 0;
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)(ray->org).values;
      local_1d0 = &local_1a8;
      auVar15 = vsubps_avx(auVar23,auVar33);
      auVar24._0_4_ = auVar15._0_4_ * local_168;
      auVar24._4_4_ = auVar15._4_4_ * fStack_164;
      auVar24._8_4_ = auVar15._8_4_ * fStack_160;
      auVar24._12_4_ = auVar15._12_4_ * fStack_15c;
      local_208._0_8_ = vmovlps_avx(auVar24);
      stack0xfffffffffffffe00 =
           (uint *)CONCAT44(auStack_1fc,
                            (v.values[2] - (ray->org).values[2]) * (float)local_178._0_4_);
      v.values[0] = ray->tmin;
      t1 = ray->tmax;
      local_1c8 = &t1;
      local_1d8 = (undefined1  [8])&v;
      local_1c0 = (Vec<float,_3UL> *)local_208;
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,0);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,1);
      anon_func::anon_class_32_4_dce2b386::operator()((anon_class_32_4_dce2b386 *)local_1d8,2);
      accel = local_1b0;
      if ((float)local_1b8 <= fVar34) {
        IVar10.value = (pNVar1->index).value;
        if (v.values[0] <= t1) {
          IVar3.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
          IVar9.value = IVar10.value;
          if (v.values[0] < (float)local_1b8) {
            IVar9.value = IVar3.value;
            IVar3.value = IVar10.value;
          }
          IVar10.value = IVar9.value;
          local_1d8._0_4_ = IVar3.value;
          bvh::v2::SmallStack<bvh::v2::Index<32UL,_4UL>,_64U>::push
                    (&stack,(Index<32UL,_4UL> *)local_1d8);
        }
      }
      else {
        if (t1 < v.values[0]) goto LAB_001079e3;
        IVar10.value = ((Index *)((long)(pNVar1 + 1) + 0x18))->value;
      }
    }
    lVar11 = uVar12 * 0x30 + 0x18;
    local_190->visited_leaves = local_190->visited_leaves + 1;
    for (; uVar12 < (IVar10.value & 0xf) + (IVar10.value >> 4); uVar12 = uVar12 + 1) {
      pPVar5 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)(ray->org).values;
      lVar2 = (long)(pPVar5->e1).values + lVar11;
      local_1b8 = (long)(pPVar5->e2).values + lVar11;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(lVar2 + -0x24);
      auVar14 = vsubps_avx(auVar25,auVar31);
      fVar7 = *(float *)(lVar2 + -0x1c) - (ray->org).values[2];
      local_1d8 = (undefined1  [8])vmovlps_avx(auVar14);
      auVar15 = vmovshdup_avx(auVar14);
      local_1d0 = (Vec<float,_3UL> *)CONCAT44(local_1d0._4_4_,fVar7);
      fVar34 = (ray->dir).values[2];
      fVar17 = (ray->dir).values[0];
      fVar18 = (ray->dir).values[1];
      auVar16 = vfmsub231ss_fma(ZEXT416((uint)(auVar15._0_4_ * fVar34)),ZEXT416((uint)fVar18),
                                ZEXT416((uint)fVar7));
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar7 * fVar17)),auVar14,ZEXT416((uint)fVar34));
      auVar14 = vfmsub231ss_fma(ZEXT416((uint)(auVar14._0_4_ * fVar18)),ZEXT416((uint)fVar17),
                                auVar15);
      auVar15 = vinsertps_avx(auVar16,auVar8,0x10);
      local_208._0_8_ = vmovlps_avx(auVar15);
      stack0xfffffffffffffe00 = (uint *)CONCAT44(auStack_1fc,auVar14._0_4_);
      fVar34 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,lVar2,local_1b8,local_188);
      fVar34 = 1.0 / fVar34;
      fVar17 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,local_208,auStack_1fc,(long)(pPVar5->p0).values + lVar11);
      fVar18 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,local_208,auStack_1fc,(long)(&pPVar5->p0 + -1) + lVar11);
      if (((-1.1920929e-07 <= fVar17 * fVar34) && (-1.1920929e-07 <= fVar34 * fVar18)) &&
         (-1.1920929e-07 <= (1.0 - fVar17 * fVar34) - fVar34 * fVar18)) {
        fVar17 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,lVar2,local_1b8,local_1d8);
        fVar17 = fVar17 * fVar34;
        if ((ray->tmin <= fVar17) && (fVar17 <= ray->tmax)) {
          ray->tmax = fVar17;
          local_198 = uVar12;
        }
      }
      lVar11 = lVar11 + 0x30;
      accel = local_1b0;
    }
  } while( true );
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}